

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_1114342::Target::DumpSysroot
          (Value *__return_storage_ptr__,Target *this,string *path)

{
  Value *this_00;
  Value *extraout_RAX;
  Value VStack_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&VStack_38,(String *)this);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(this_00,&VStack_38);
  Json::Value::~Value(&VStack_38);
  return extraout_RAX;
}

Assistant:

Json::Value Target::DumpSysroot(std::string const& path)
{
  Json::Value sysroot = Json::objectValue;
  sysroot["path"] = path;
  return sysroot;
}